

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCondition.hpp
# Opt level: O3

Status __thiscall
AO::BehaviorTree::Version_1::Details::FunctionCondition<Agent,_short>::decide
          (FunctionCondition<Agent,_short> *this,EntityPtr entity,short args)

{
  Status SVar1;
  short local_a;
  EntityPtr local_8;
  
  local_a = args;
  local_8 = entity;
  if ((this->function).super__Function_base._M_manager != (_Manager_type)0x0) {
    SVar1 = (*(this->function)._M_invoker)((_Any_data *)&this->function,&local_8,&local_a);
    return SVar1;
  }
  std::__throw_bad_function_call();
}

Assistant:

Status decide(EntityPtr entity, Args... args) override final
					{
						return function(entity, args...);
					}